

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdmauth.c
# Opt level: O2

ssh_cipher * des_xdmauth_cipher(void *vkeydata)

{
  long lVar1;
  ssh_cipher *psVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uchar key [8];
  
  iVar3 = 0;
  iVar4 = 0;
  uVar5 = 0;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    if (iVar3 < 7) {
      uVar5 = uVar5 << 8 | (uint)*(byte *)((long)vkeydata + (long)iVar4);
      iVar3 = iVar3 + 8;
      iVar4 = iVar4 + 1;
    }
    iVar3 = iVar3 + -7;
    key[lVar1] = (char)(uVar5 >> ((byte)iVar3 & 0x1f)) * '\x02';
    uVar5 = uVar5 & ~(0x7f << ((byte)iVar3 & 0x1f));
  }
  psVar2 = des_cbc_new(&ssh_des);
  (*psVar2->vt->setkey)(psVar2,key);
  smemclr(key,8);
  (*psVar2->vt->setiv)(psVar2,key);
  return psVar2;
}

Assistant:

static ssh_cipher *des_xdmauth_cipher(const void *vkeydata)
{
    /*
     * XDM-AUTHORIZATION-1 uses single-DES, but packs the key into 7
     * bytes, so here we have to repack it manually into the canonical
     * form where it occupies 8 bytes each with the low bit unused.
     */
    const unsigned char *keydata = (const unsigned char *)vkeydata;
    unsigned char key[8];
    int i, nbits, j;
    unsigned int bits;

    bits = 0;
    nbits = 0;
    j = 0;
    for (i = 0; i < 8; i++) {
        if (nbits < 7) {
            bits = (bits << 8) | keydata[j];
            nbits += 8;
            j++;
        }
        key[i] = (bits >> (nbits - 7)) << 1;
        bits &= ~(0x7F << (nbits - 7));
        nbits -= 7;
    }

    ssh_cipher *c = ssh_cipher_new(&ssh_des);
    ssh_cipher_setkey(c, key);
    smemclr(key, sizeof(key));
    ssh_cipher_setiv(c, key);
    return c;
}